

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

UnicodeSet * __thiscall
icu_63::RuleBasedCollator::getTailoredSet(RuleBasedCollator *this,UErrorCode *errorCode)

{
  UBool UVar1;
  RuleBasedCollator *pRVar2;
  CollationData *d;
  RuleBasedCollator *local_c0;
  TailoredSet local_b0;
  undefined1 local_31;
  RuleBasedCollator *local_30;
  RuleBasedCollator *local_28;
  UnicodeSet *tailored;
  UErrorCode *errorCode_local;
  RuleBasedCollator *this_local;
  
  tailored = (UnicodeSet *)errorCode;
  errorCode_local = (UErrorCode *)this;
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    pRVar2 = (RuleBasedCollator *)UMemory::operator_new((UMemory *)0x58,(size_t)errorCode);
    local_31 = 0;
    local_c0 = (RuleBasedCollator *)0x0;
    if (pRVar2 != (RuleBasedCollator *)0x0) {
      local_31 = 1;
      local_30 = pRVar2;
      UnicodeSet::UnicodeSet((UnicodeSet *)pRVar2);
      local_c0 = pRVar2;
    }
    local_28 = local_c0;
    if (local_c0 == (RuleBasedCollator *)0x0) {
      *(undefined4 *)
       &(tailored->super_UnicodeFilter).super_UnicodeFunctor.super_UObject._vptr_UObject = 7;
      this_local = (RuleBasedCollator *)0x0;
    }
    else {
      if (this->data->base != (CollationData *)0x0) {
        TailoredSet::TailoredSet(&local_b0,(UnicodeSet *)local_c0);
        d = this->data;
        TailoredSet::forData(&local_b0,d,(UErrorCode *)tailored);
        TailoredSet::~TailoredSet(&local_b0);
        UVar1 = ::U_FAILURE(*(UErrorCode *)
                             &(tailored->super_UnicodeFilter).super_UnicodeFunctor.super_UObject.
                              _vptr_UObject);
        pRVar2 = local_28;
        if (UVar1 != '\0') {
          if (local_28 != (RuleBasedCollator *)0x0) {
            UnicodeSet::~UnicodeSet((UnicodeSet *)local_28);
            UMemory::operator_delete((UMemory *)pRVar2,d);
          }
          return (UnicodeSet *)0x0;
        }
      }
      this_local = local_28;
    }
  }
  else {
    this_local = (RuleBasedCollator *)0x0;
  }
  return (UnicodeSet *)this_local;
}

Assistant:

UnicodeSet *
RuleBasedCollator::getTailoredSet(UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) { return NULL; }
    UnicodeSet *tailored = new UnicodeSet();
    if(tailored == NULL) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
        return NULL;
    }
    if(data->base != NULL) {
        TailoredSet(tailored).forData(data, errorCode);
        if(U_FAILURE(errorCode)) {
            delete tailored;
            return NULL;
        }
    }
    return tailored;
}